

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_url_encode(char *src,char *dst,size_t dst_len)

{
  ushort **ppuVar1;
  char *pcVar2;
  int local_38;
  char *end;
  char *pos;
  size_t dst_len_local;
  char *dst_local;
  char *src_local;
  
  end = dst;
  for (dst_local = src; *dst_local != '\0' && end < dst + (dst_len - 1); dst_local = dst_local + 1)
  {
    ppuVar1 = __ctype_b_loc();
    if ((((*ppuVar1)[(int)(uint)(byte)*dst_local] & 8) == 0) &&
       (pcVar2 = strchr(mg_url_encode::dont_escape,(int)*dst_local), pcVar2 == (char *)0x0)) {
      if (dst + (dst_len - 1) <= end + 2) break;
      *end = '%';
      end[1] = mg_url_encode::hex[(int)(uint)(byte)*dst_local >> 4];
      end[2] = mg_url_encode::hex[(int)((byte)*dst_local & 0xf)];
      end = end + 2;
    }
    else {
      *end = *dst_local;
    }
    end = end + 1;
  }
  *end = '\0';
  if (*dst_local == '\0') {
    local_38 = (int)end - (int)dst;
  }
  else {
    local_38 = -1;
  }
  return local_38;
}

Assistant:

CIVETWEB_API int
mg_url_encode(const char *src, char *dst, size_t dst_len)
{
	static const char *dont_escape = "._-$,;~()";
	static const char *hex = "0123456789abcdef";
	char *pos = dst;
	const char *end = dst + dst_len - 1;

	for (; ((*src != '\0') && (pos < end)); src++, pos++) {
		if (isalnum((unsigned char)*src)
		    || (strchr(dont_escape, *src) != NULL)) {
			*pos = *src;
		} else if (pos + 2 < end) {
			pos[0] = '%';
			pos[1] = hex[(unsigned char)*src >> 4];
			pos[2] = hex[(unsigned char)*src & 0xf];
			pos += 2;
		} else {
			break;
		}
	}

	*pos = '\0';
	return (*src == '\0') ? (int)(pos - dst) : -1;
}